

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::AsymSignInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool inAllowMultiPartOp;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  Session *this_00;
  Token *pTVar8;
  long *plVar9;
  ulong uVar10;
  CK_STATE sessionState;
  CryptoFactory *pCVar11;
  undefined4 extraout_var;
  CK_RV CVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *in_RDX;
  Session *in_RDI;
  PrivateKey *privateKey;
  AsymmetricAlgorithm *asymCrypto;
  unsigned_long allowedMgf;
  bool isEDDSA;
  bool isECDSA;
  bool isDSA;
  bool isRSA;
  bool bAllowMultiPartOp;
  RSA_PKCS_PSS_PARAMS pssParam;
  size_t paramLen;
  void *param;
  Type mechanism;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *key;
  Token *token;
  Session *session;
  OSObject *in_stack_000001b0;
  Token *in_stack_000001b8;
  DSAPrivateKey *in_stack_000001c0;
  SoftHSM *in_stack_000001c8;
  OSObject *in_stack_000003f0;
  Token *in_stack_000003f8;
  RSAPrivateKey *in_stack_00000400;
  SoftHSM *in_stack_00000408;
  Session *in_stack_ffffffffffffff48;
  Session *in_stack_ffffffffffffff50;
  void *inParam;
  long local_98;
  long *local_90;
  long local_88;
  undefined4 local_78;
  undefined4 local_74;
  CK_OBJECT_HANDLE in_stack_ffffffffffffff90;
  HandleManager *in_stack_ffffffffffffff98;
  undefined8 uVar13;
  undefined4 *local_60;
  Type local_54;
  CK_RV local_8;
  
  if (((ulong)in_RDI->slot & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == (long *)0x0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar7 = Session::getOpType(this_00);
      if (iVar7 == 0) {
        pTVar8 = Session::getToken(this_00);
        if (pTVar8 == (Token *)0x0) {
          local_8 = 5;
        }
        else {
          plVar9 = (long *)HandleManager::getObject
                                     (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          if ((plVar9 == (long *)0x0) ||
             (uVar10 = (**(code **)(*plVar9 + 0x50))(), (uVar10 & 1) == 0)) {
            local_8 = 0x82;
          }
          else {
            bVar4 = (**(code **)(*plVar9 + 0x20))(plVar9,1,0);
            bVar5 = (**(code **)(*plVar9 + 0x20))(plVar9,2,1);
            sessionState = Session::getState(in_stack_ffffffffffffff48);
            local_8 = haveRead(sessionState,bVar4 & 1,bVar5 & 1);
            if (local_8 == 0) {
              uVar10 = (**(code **)(*plVar9 + 0x20))(plVar9,0x108,0);
              if ((uVar10 & 1) == 0) {
                local_8 = 0x68;
              }
              else {
                bVar6 = isMechanismPermitted(this,(OSObject *)hSession,pMechanism);
                if (bVar6) {
                  local_60 = (undefined4 *)0x0;
                  uVar13 = 0;
                  bVar6 = false;
                  bVar1 = false;
                  bVar2 = false;
                  bVar3 = false;
                  inParam = (void *)*in_RDX;
                  if (inParam == (void *)0x1) {
                    local_54 = RSA_PKCS;
                    inAllowMultiPartOp = false;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x3) {
                    local_54 = RSA;
                    inAllowMultiPartOp = false;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x5) {
                    local_54 = RSA_MD5_PKCS;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x6) {
                    local_54 = RSA_SHA1_PKCS;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0xd) {
                    if ((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x105c,"Invalid RSA-PSS parameters");
                      return 7;
                    }
                    local_54 = RSA_PKCS_PSS;
                    in_stack_ffffffffffffff50 = *(Session **)in_RDX[1];
                    if (in_stack_ffffffffffffff50 == (Session *)0x220) {
                      local_78 = 2;
                      local_74 = 1;
                      local_88 = 1;
                    }
                    else if (in_stack_ffffffffffffff50 == (Session *)0x250) {
                      local_78 = 4;
                      local_74 = 3;
                      local_88 = 2;
                    }
                    else if (in_stack_ffffffffffffff50 == (Session *)0x255) {
                      local_78 = 3;
                      local_74 = 2;
                      local_88 = 5;
                    }
                    else if (in_stack_ffffffffffffff50 == (Session *)0x260) {
                      local_78 = 5;
                      local_74 = 4;
                      local_88 = 3;
                    }
                    else {
                      if (in_stack_ffffffffffffff50 != (Session *)0x270) {
                        softHSMLog(3,"AsymSignInit",
                                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                   ,0x107d,"Invalid RSA-PSS hash");
                        return 7;
                      }
                      local_78 = 6;
                      local_74 = 5;
                      local_88 = 4;
                    }
                    if (*(long *)(in_RDX[1] + 8) != local_88) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x1082,"Hash and MGF don\'t match");
                      return 7;
                    }
                    local_60 = &local_78;
                    uVar13 = 0x10;
                    inAllowMultiPartOp = false;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0xe) {
                    if ((((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) || (*(long *)in_RDX[1] != 0x220))
                       || (*(long *)(in_RDX[1] + 8) != 1)) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x1093,"Invalid parameters");
                      return 7;
                    }
                    local_54 = RSA_SHA1_PKCS_PSS;
                    local_78 = 2;
                    local_74 = 1;
                    local_60 = &local_78;
                    uVar13 = 0x10;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x11) {
                    local_54 = DSA;
                    inAllowMultiPartOp = false;
                    bVar1 = true;
                  }
                  else if (inParam == (void *)0x12) {
                    local_54 = DSA_SHA1;
                    inAllowMultiPartOp = true;
                    bVar1 = true;
                  }
                  else if (inParam == (void *)0x13) {
                    local_54 = DSA_SHA224;
                    inAllowMultiPartOp = true;
                    bVar1 = true;
                  }
                  else if (inParam == (void *)0x14) {
                    local_54 = DSA_SHA256;
                    inAllowMultiPartOp = true;
                    bVar1 = true;
                  }
                  else if (inParam == (void *)0x15) {
                    local_54 = DSA_SHA384;
                    inAllowMultiPartOp = true;
                    bVar1 = true;
                  }
                  else if (inParam == (void *)0x16) {
                    local_54 = DSA_SHA512;
                    inAllowMultiPartOp = true;
                    bVar1 = true;
                  }
                  else if (inParam == (void *)0x40) {
                    local_54 = RSA_SHA256_PKCS;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x41) {
                    local_54 = RSA_SHA384_PKCS;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x42) {
                    local_54 = RSA_SHA512_PKCS;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x43) {
                    if (((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) ||
                       ((*(long *)in_RDX[1] != 0x250 || (*(long *)(in_RDX[1] + 8) != 2)))) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x10b7,"Invalid parameters");
                      return 7;
                    }
                    local_54 = RSA_SHA256_PKCS_PSS;
                    local_78 = 4;
                    local_74 = 3;
                    local_60 = &local_78;
                    uVar13 = 0x10;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x44) {
                    if (((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) ||
                       ((*(long *)in_RDX[1] != 0x260 || (*(long *)(in_RDX[1] + 8) != 3)))) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x10c9,"Invalid parameters");
                      return 7;
                    }
                    local_54 = RSA_SHA384_PKCS_PSS;
                    local_78 = 5;
                    local_74 = 4;
                    local_60 = &local_78;
                    uVar13 = 0x10;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x45) {
                    if ((((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) || (*(long *)in_RDX[1] != 0x270))
                       || (*(long *)(in_RDX[1] + 8) != 4)) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x10db,"Invalid parameters");
                      return 7;
                    }
                    local_54 = RSA_SHA512_PKCS_PSS;
                    local_78 = 6;
                    local_74 = 5;
                    local_60 = &local_78;
                    uVar13 = 0x10;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x46) {
                    local_54 = RSA_SHA224_PKCS;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x47) {
                    if (((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) ||
                       ((*(long *)in_RDX[1] != 0x255 || (*(long *)(in_RDX[1] + 8) != 5)))) {
                      softHSMLog(3,"AsymSignInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x10a5,"Invalid parameters");
                      return 7;
                    }
                    local_54 = RSA_SHA224_PKCS_PSS;
                    local_78 = 3;
                    local_74 = 2;
                    local_60 = &local_78;
                    uVar13 = 0x10;
                    inAllowMultiPartOp = true;
                    bVar6 = true;
                  }
                  else if (inParam == (void *)0x1041) {
                    local_54 = ECDSA;
                    inAllowMultiPartOp = false;
                    bVar2 = true;
                  }
                  else {
                    if (inParam != (void *)0x1057) {
                      return 0x70;
                    }
                    local_54 = EDDSA;
                    inAllowMultiPartOp = false;
                    bVar3 = true;
                  }
                  if (bVar6) {
                    pCVar11 = CryptoFactory::i();
                    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,1);
                    local_90 = (long *)CONCAT44(extraout_var,iVar7);
                    if (local_90 == (long *)0x0) {
                      return 0x70;
                    }
                    local_98 = (**(code **)(*local_90 + 0xb0))();
                    if (local_98 == 0) {
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 2;
                    }
                    CVar12 = getRSAPrivateKey(in_stack_00000408,in_stack_00000400,in_stack_000003f8,
                                              in_stack_000003f0);
                    if (CVar12 != 0) {
                      (**(code **)(*local_90 + 0xd8))(local_90,local_98);
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 5;
                    }
                  }
                  else if (bVar1) {
                    pCVar11 = CryptoFactory::i();
                    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,2);
                    local_90 = (long *)CONCAT44(extraout_var_00,iVar7);
                    if (local_90 == (long *)0x0) {
                      return 0x70;
                    }
                    local_98 = (**(code **)(*local_90 + 0xb0))();
                    if (local_98 == 0) {
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 2;
                    }
                    CVar12 = getDSAPrivateKey(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                                              in_stack_000001b0);
                    if (CVar12 != 0) {
                      (**(code **)(*local_90 + 0xd8))(local_90,local_98);
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 5;
                    }
                  }
                  else if (bVar2) {
                    pCVar11 = CryptoFactory::i();
                    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,5);
                    local_90 = (long *)CONCAT44(extraout_var_01,iVar7);
                    if (local_90 == (long *)0x0) {
                      return 0x70;
                    }
                    local_98 = (**(code **)(*local_90 + 0xb0))();
                    if (local_98 == 0) {
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 2;
                    }
                    CVar12 = getECPrivateKey((SoftHSM *)pMechanism,(ECPrivateKey *)hKey,
                                             (Token *)session,(OSObject *)token);
                    if (CVar12 != 0) {
                      (**(code **)(*local_90 + 0xd8))(local_90,local_98);
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 5;
                    }
                  }
                  else {
                    if (!bVar3) {
                      return 0x70;
                    }
                    pCVar11 = CryptoFactory::i();
                    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,7);
                    local_90 = (long *)CONCAT44(extraout_var_02,iVar7);
                    if (local_90 == (long *)0x0) {
                      return 0x70;
                    }
                    local_98 = (**(code **)(*local_90 + 0xb0))();
                    if (local_98 == 0) {
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 2;
                    }
                    CVar12 = getEDPrivateKey((SoftHSM *)pMechanism,(EDPrivateKey *)hKey,
                                             (Token *)session,(OSObject *)token);
                    if (CVar12 != 0) {
                      (**(code **)(*local_90 + 0xd8))(local_90,local_98);
                      pCVar11 = CryptoFactory::i();
                      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                      return 5;
                    }
                  }
                  if ((inAllowMultiPartOp) &&
                     (uVar10 = (**(code **)(*local_90 + 0x18))
                                         (local_90,local_98,local_54,local_60,uVar13),
                     (uVar10 & 1) == 0)) {
                    (**(code **)(*local_90 + 0xd8))(local_90,local_98);
                    pCVar11 = CryptoFactory::i();
                    (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,local_90);
                    local_8 = 0x70;
                  }
                  else {
                    uVar10 = (**(code **)(*plVar9 + 0x20))(plVar9,0x202,0);
                    if ((uVar10 & 1) != 0) {
                      Session::setReAuthentication(this_00,true);
                    }
                    Session::setOpType(this_00,5);
                    Session::setAsymmetricCryptoOp
                              (in_stack_ffffffffffffff50,
                               (AsymmetricAlgorithm *)in_stack_ffffffffffffff48);
                    Session::setMechanism(this_00,local_54);
                    Session::setParameters(in_RDI,inParam,(size_t)in_stack_ffffffffffffff50);
                    Session::setAllowMultiPartOp(this_00,inAllowMultiPartOp);
                    Session::setAllowSinglePartOp(this_00,true);
                    Session::setPrivateKey
                              (in_stack_ffffffffffffff50,(PrivateKey *)in_stack_ffffffffffffff48);
                    local_8 = 0;
                  }
                }
                else {
                  local_8 = 0x70;
                }
              }
            }
            else if (local_8 == 0x101) {
              softHSMLog(6,"AsymSignInit",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x1011,"User is not authorized");
            }
          }
        }
      }
      else {
        local_8 = 0x90;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::AsymSignInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for signing
	if (!key->getBooleanValue(CKA_SIGN, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid RSA-PSS parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;
			unsigned long allowedMgf;

			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					allowedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					allowedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					allowedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					allowedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					allowedMgf = CKG_MGF1_SHA512;
					break;
				default:
					ERROR_MSG("Invalid RSA-PSS hash");
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != allowedMgf) {
				ERROR_MSG("Hash and MGF don't match");
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PrivateKey* privateKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPrivateKey((RSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPrivateKey((DSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPrivateKey((ECPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPrivateKey((EDPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPrivateKey((GOSTPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }